

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall
SharedPtrTests_misc_Swap_Test::~SharedPtrTests_misc_Swap_Test(SharedPtrTests_misc_Swap_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SharedPtrTests_misc, Swap) {
	int* a;
	a = new int;
	*a = 4;
	int* b = new int{ 5 };
	SharedPtr<int> t1(a);
	SharedPtr<int> t2(b);
	std::swap(t1, t2);
	EXPECT_EQ(t2.use_count(), 1);
	EXPECT_EQ(t1.use_count(), 1);
	EXPECT_EQ(t2.get(), a);
	EXPECT_EQ(t1.get(), b);
}